

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_recursive_mutex.hpp
# Opt level: O1

void __thiscall
wigwag::threading::shared_recursive_mutex::lock_primitive::lock_recursive(lock_primitive *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)
                             (this->_mutex).
                             super___shared_ptr<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  if (iVar1 == 0) {
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void lock_recursive() const { _mutex->lock(); }